

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_inline.cpp
# Opt level: O0

BBLIter __thiscall
mocker::FunctionInline::inlineFunction
          (FunctionInline *this,FunctionModule *caller,BBLIter bbIter,InstListIter callInstIter)

{
  pointer *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  reference v;
  FuncsMap *this_00;
  element_type *peVar3;
  string *psVar4;
  mapped_type *pmVar5;
  _Self *p_Var6;
  __shared_ptr *p_Var7;
  pointer pBVar8;
  InstList *pIVar9;
  InstList *pIVar10;
  InstList *this_01;
  list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
  *this_02;
  shared_ptr<mocker::ir::Reg> *__args_1;
  size_t sVar11;
  mapped_type *pmVar12;
  pointer this_03;
  reference this_04;
  reference v_00;
  string *__k;
  mapped_type *this_05;
  element_type *peVar13;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *this_06;
  const_reference pvVar14;
  element_type *peVar15;
  element_type *this_07;
  __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var16;
  element_type *peVar17;
  reference v_01;
  element_type *peVar18;
  shared_ptr<mocker::ir::Addr> *psVar19;
  size_t in_R9;
  uint in_stack_fffffffffffff888;
  shared_ptr<mocker::ir::IRInst> *this_08;
  shared_ptr<mocker::ir::Label> local_510;
  shared_ptr<mocker::ir::Jump> local_500;
  shared_ptr<mocker::ir::IRInst> local_4f0;
  byte local_4dd;
  undefined4 local_4dc;
  shared_ptr<mocker::ir::IntLiteral> local_4d8;
  shared_ptr<mocker::ir::Addr> local_4c8;
  shared_ptr<mocker::ir::Reg> local_4b8;
  shared_ptr<mocker::ir::IRInst> local_4a8;
  undefined1 local_498 [8];
  shared_ptr<mocker::ir::Ret> ret;
  BasicBlock *bb_2;
  BBLIter iter_1;
  _List_iterator<mocker::ir::BasicBlock> local_468;
  undefined1 local_460 [8];
  shared_ptr<mocker::ir::Alloca> alloca;
  shared_ptr<mocker::ir::Label> local_448;
  shared_ptr<mocker::ir::Jump> local_438;
  undefined1 local_428 [8];
  shared_ptr<mocker::ir::Jump> jump;
  shared_ptr<mocker::ir::Label> local_410;
  size_t local_400;
  shared_ptr<mocker::ir::Label> local_3f8;
  shared_ptr<mocker::ir::Addr> local_3e8;
  undefined1 local_3d8 [8];
  shared_ptr<mocker::ir::Branch> br;
  undefined1 local_3b8 [24];
  long n;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Addr> *operand;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *__range3;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  undefined1 local_348 [8];
  shared_ptr<mocker::ir::Reg> newDest;
  shared_ptr<mocker::ir::Addr> local_328;
  undefined1 local_318 [8];
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::IRInst> *inst;
  iterator __end2;
  iterator __begin2;
  InstList *__range2;
  BasicBlock *bb_1;
  BBLIter iter;
  BBLIter insertedBeg;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newIdent;
  size_t local_280;
  shared_ptr<mocker::ir::Label> local_278;
  shared_ptr<mocker::ir::Jump> local_268;
  shared_ptr<mocker::ir::IRInst> local_258;
  size_t local_248;
  _List_node_base *local_240;
  _List_iterator<mocker::ir::BasicBlock> local_238;
  BasicBlock *local_230;
  BasicBlock *curBB;
  BasicBlock *bb;
  undefined1 local_218 [8];
  const_reverse_iterator riter;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  newLabelID;
  iterator local_1c8;
  _List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> local_1c0;
  FunctionInline *local_1b8;
  iterator local_1b0;
  _List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> local_1a8;
  _List_node_base *local_1a0;
  shared_ptr<mocker::ir::Alloca> local_198;
  shared_ptr<mocker::ir::IRInst> local_188;
  _List_iterator<mocker::ir::BasicBlock> local_178;
  allocator<char> local_169;
  string local_168 [32];
  undefined1 local_148 [24];
  shared_ptr<mocker::ir::Reg> retVal;
  mapped_type callee;
  shared_ptr<mocker::ir::Call> call;
  FunctionModule *caller_local;
  FunctionInline *this_local;
  InstListIter callInstIter_local;
  BBLIter bbIter_local;
  BBLIter succBBIter;
  
  this_local = (FunctionInline *)callInstIter._M_node;
  callInstIter_local._M_node = bbIter._M_node;
  v = std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                ((_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)&this_local);
  ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&callee.predecessors._M_h._M_single_bucket,v);
  this_00 = ir::Module::getFuncs_abi_cxx11_((this->super_ModulePass).module);
  peVar3 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&callee.predecessors._M_h._M_single_bucket);
  psVar4 = ir::Call::getFuncName_abi_cxx11_(peVar3);
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
           ::at(this_00,psVar4);
  ir::FunctionModule::FunctionModule((FunctionModule *)&stack0xfffffffffffffee8,pmVar5);
  bVar2 = ir::FunctionModule::isExternalFunc((FunctionModule *)&stack0xfffffffffffffee8);
  if (bVar2) {
    p_Var6 = std::_List_iterator<mocker::ir::BasicBlock>::operator++
                       ((_List_iterator<mocker::ir::BasicBlock> *)&callInstIter_local);
    bbIter_local._M_node = p_Var6->_M_node;
    retVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
  }
  else {
    std::shared_ptr<mocker::ir::Reg>::shared_ptr
              ((shared_ptr<mocker::ir::Reg> *)(local_148 + 0x10),(nullptr_t)0x0);
    peVar3 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&callee.predecessors._M_h._M_single_bucket);
    p_Var7 = (__shared_ptr *)ir::Definition::getDest(&peVar3->super_Definition);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var7);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_168,"retVal",&local_169);
      ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_148,&caller->identifier);
      std::shared_ptr<mocker::ir::Reg>::operator=
                ((shared_ptr<mocker::ir::Reg> *)(local_148 + 0x10),
                 (shared_ptr<mocker::ir::Reg> *)local_148);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_148);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator(&local_169);
      local_178._M_node = (_List_node_base *)ir::FunctionModule::getFirstBB(caller);
      pBVar8 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&local_178);
      std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
                ((shared_ptr<mocker::ir::Reg> *)&local_198);
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Alloca,void>
                (&local_188,&local_198);
      ir::BasicBlock::appendInstFront(pBVar8,&local_188);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_188);
      std::shared_ptr<mocker::ir::Alloca>::~shared_ptr(&local_198);
    }
    local_1a0 = callInstIter_local._M_node;
    bbIter_local = ir::FunctionModule::insertBBAfter(caller,callInstIter_local._M_node);
    pBVar8 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&bbIter_local);
    pIVar9 = ir::BasicBlock::getMutableInsts_abi_cxx11_(pBVar8);
    pBVar8 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&bbIter_local);
    pIVar10 = ir::BasicBlock::getMutableInsts_abi_cxx11_(pBVar8);
    local_1b0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
         ::end(pIVar10);
    std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::_List_const_iterator
              (&local_1a8,&local_1b0);
    pBVar8 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                       ((_List_iterator<mocker::ir::BasicBlock> *)&callInstIter_local);
    pIVar10 = ir::BasicBlock::getMutableInsts_abi_cxx11_(pBVar8);
    local_1b8 = this_local;
    pBVar8 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                       ((_List_iterator<mocker::ir::BasicBlock> *)&callInstIter_local);
    this_01 = ir::BasicBlock::getMutableInsts_abi_cxx11_(pBVar8);
    local_1c8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
         ::end(this_01);
    std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::_List_const_iterator
              (&local_1c0,&local_1c8);
    std::__cxx11::
    list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
    ::splice(pIVar9,(int)local_1a8._M_node,(__off64_t *)pIVar10,(int)local_1b8,
             (__off64_t *)local_1c0._M_node,in_R9,in_stack_fffffffffffff888);
    pBVar8 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&bbIter_local);
    pIVar9 = ir::BasicBlock::getMutableInsts_abi_cxx11_(pBVar8);
    std::__cxx11::
    list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
    ::pop_front(pIVar9);
    peVar3 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&callee.predecessors._M_h._M_single_bucket);
    p_Var7 = (__shared_ptr *)ir::Definition::getDest(&peVar3->super_Definition);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var7);
    if (bVar2) {
      pBVar8 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&bbIter_local);
      this_02 = (list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                 *)ir::BasicBlock::getMutableInsts_abi_cxx11_(pBVar8);
      peVar3 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&callee.predecessors._M_h._M_single_bucket);
      __args_1 = ir::Definition::getDest(&peVar3->super_Definition);
      std::
      make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Reg>&>
                ((shared_ptr<mocker::ir::Reg> *)&newLabelID._M_h._M_single_bucket,__args_1);
      std::__cxx11::
      list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
      ::emplace_front<std::shared_ptr<mocker::ir::Load>>
                (this_02,(shared_ptr<mocker::ir::Load> *)&newLabelID._M_h._M_single_bucket);
      std::shared_ptr<mocker::ir::Load>::~shared_ptr
                ((shared_ptr<mocker::ir::Load> *)&newLabelID._M_h._M_single_bucket);
    }
    std::
    unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::unordered_map((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     *)&riter);
    ir::FunctionModule::getBBs_abi_cxx11_((FunctionModule *)&stack0xfffffffffffffee8);
    std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::rbegin
              ((list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)local_218);
    while( true ) {
      ir::FunctionModule::getBBs_abi_cxx11_((FunctionModule *)&stack0xfffffffffffffee8);
      std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::rend
                ((list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)&bb);
      bVar2 = std::operator!=((reverse_iterator<std::_List_const_iterator<mocker::ir::BasicBlock>_>
                               *)local_218,
                              (reverse_iterator<std::_List_const_iterator<mocker::ir::BasicBlock>_>
                               *)&bb);
      if (!bVar2) break;
      curBB = std::reverse_iterator<std::_List_const_iterator<mocker::ir::BasicBlock>_>::operator*
                        ((reverse_iterator<std::_List_const_iterator<mocker::ir::BasicBlock>_> *)
                         local_218);
      local_240 = callInstIter_local._M_node;
      local_238._M_node =
           (_List_node_base *)ir::FunctionModule::insertBBAfter(caller,callInstIter_local._M_node);
      local_230 = std::_List_iterator<mocker::ir::BasicBlock>::operator*(&local_238);
      pIVar9 = ir::BasicBlock::getInsts_abi_cxx11_(curBB);
      pIVar10 = ir::BasicBlock::getMutableInsts_abi_cxx11_(local_230);
      std::__cxx11::
      list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
      ::operator=(pIVar10,pIVar9);
      sVar11 = ir::BasicBlock::getLabelID(local_230);
      local_248 = ir::BasicBlock::getLabelID(curBB);
      pmVar12 = std::
                unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)&riter,&local_248);
      *pmVar12 = sVar11;
      std::reverse_iterator<std::_List_const_iterator<mocker::ir::BasicBlock>_>::operator++
                ((reverse_iterator<std::_List_const_iterator<mocker::ir::BasicBlock>_> *)local_218);
    }
    pBVar8 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                       ((_List_iterator<mocker::ir::BasicBlock> *)&callInstIter_local);
    newIdent._M_h._M_single_bucket =
         (__node_base_ptr)ir::FunctionModule::getFirstBB((FunctionModule *)&stack0xfffffffffffffee8)
    ;
    this_03 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                        ((_List_iterator<mocker::ir::BasicBlock> *)&newIdent._M_h._M_single_bucket);
    local_280 = ir::BasicBlock::getLabelID(this_03);
    std::
    unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::at((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *)&riter,&local_280);
    std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_278);
    std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>>
              ((shared_ptr<mocker::ir::Label> *)&local_268);
    std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Jump,void>(&local_258,&local_268);
    ir::BasicBlock::appendInst(pBVar8,&local_258);
    std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_258);
    std::shared_ptr<mocker::ir::Jump>::~shared_ptr(&local_268);
    std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_278);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&insertedBeg);
    iter._M_node = callInstIter_local._M_node;
    std::_List_iterator<mocker::ir::BasicBlock>::operator++(&iter);
    bb_1 = (BasicBlock *)iter._M_node;
    while (bVar2 = std::operator!=((_Self *)&bb_1,&bbIter_local), bVar2) {
      this_04 = std::_List_iterator<mocker::ir::BasicBlock>::operator*
                          ((_List_iterator<mocker::ir::BasicBlock> *)&bb_1);
      pIVar9 = ir::BasicBlock::getMutableInsts_abi_cxx11_(this_04);
      __end2 = std::__cxx11::
               list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
               ::begin(pIVar9);
      inst = (shared_ptr<mocker::ir::IRInst> *)
             std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::end(pIVar9);
      while (bVar2 = std::operator!=(&__end2,(_Self *)&inst), bVar2) {
        v_00 = std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2);
        ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)&dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,v_00);
        bVar2 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          __assert_fail("!ir::dyc<ir::Phi>(inst)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/function_inline.cpp"
                        ,0xa0,
                        "ir::BBLIter mocker::FunctionInline::inlineFunction(ir::FunctionModule &, ir::BBLIter, ir::InstListIter)"
                       );
        }
        std::shared_ptr<mocker::ir::Phi>::~shared_ptr
                  ((shared_ptr<mocker::ir::Phi> *)
                   &dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        ir::getDest((ir *)&newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,v_00);
        std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                  (&local_328,
                   (shared_ptr<mocker::ir::Reg> *)
                   &newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        ir::dycLocalReg((ir *)local_318,&local_328);
        std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_328);
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr
                  ((shared_ptr<mocker::ir::Reg> *)
                   &newDest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_318);
        if (bVar2) {
          peVar13 = std::
                    __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_318);
          ir::Reg::getIdentifier_abi_cxx11_(peVar13);
          ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_348,&caller->identifier);
          ir::copyWithReplacedDest
                    ((ir *)&operands.
                            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,v_00,
                     (shared_ptr<mocker::ir::Reg> *)local_348);
          __r = &operands.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::shared_ptr<mocker::ir::IRInst>::operator=(v_00,(shared_ptr<mocker::ir::IRInst> *)__r)
          ;
          std::shared_ptr<mocker::ir::IRInst>::~shared_ptr((shared_ptr<mocker::ir::IRInst> *)__r);
          peVar13 = std::
                    __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_348);
          psVar4 = ir::Reg::getIdentifier_abi_cxx11_(peVar13);
          peVar13 = std::
                    __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_318);
          __k = ir::Reg::getIdentifier_abi_cxx11_(peVar13);
          this_05 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&insertedBeg,__k);
          std::__cxx11::string::operator=((string *)this_05,(string *)psVar4);
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_348);
        }
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_318);
        ir::getOperandsUsed((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                             *)&__range3,v_00);
        __end3 = std::
                 vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ::begin((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          *)&__range3);
        operand = (shared_ptr<mocker::ir::Addr> *)
                  std::
                  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ::end((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         *)&__range3);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                                           *)&operand), bVar2) {
          reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
               ::operator*(&__end3);
          ir::dycLocalReg((ir *)&n,(shared_ptr<mocker::ir::Addr> *)
                                   reg.
                                   super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&n);
          if (bVar2) {
            peVar13 = std::
                      __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&n);
            psVar4 = ir::Reg::getIdentifier_abi_cxx11_(peVar13);
            bVar2 = isParameter(this,(FunctionModule *)&stack0xfffffffffffffee8,psVar4);
            if (bVar2) {
              peVar13 = std::
                        __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&n);
              psVar4 = ir::Reg::getIdentifier_abi_cxx11_(peVar13);
              local_3b8._16_8_ = std::__cxx11::stol(psVar4,(size_t *)0x0,10);
              peVar3 = std::
                       __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&callee.predecessors._M_h._M_single_bucket);
              this_06 = ir::Call::getArgs(peVar3);
              pvVar14 = std::
                        vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                        ::at(this_06,local_3b8._16_8_);
              std::shared_ptr<mocker::ir::Addr>::operator=
                        ((shared_ptr<mocker::ir::Addr> *)
                         reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi,pvVar14);
              retVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_ = 0xb;
            }
            else {
              peVar13 = std::
                        __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&n);
              psVar4 = ir::Reg::getIdentifier_abi_cxx11_(peVar13);
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&insertedBeg,psVar4);
              std::make_shared<mocker::ir::Reg,std::__cxx11::string&>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3b8);
              std::shared_ptr<mocker::ir::Addr>::operator=
                        ((shared_ptr<mocker::ir::Addr> *)
                         reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_3b8);
              std::shared_ptr<mocker::ir::Reg>::~shared_ptr
                        ((shared_ptr<mocker::ir::Reg> *)local_3b8);
              retVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_ = 0;
            }
          }
          else {
            retVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ._0_4_ = 0xb;
          }
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)&n);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
          ::operator++(&__end3);
        }
        ir::copyWithReplacedOperands
                  ((ir *)&br.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,v_00,
                   (vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    *)&__range3);
        __r_00 = &br.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<mocker::ir::IRInst>::operator=
                  (v_00,(shared_ptr<mocker::ir::IRInst> *)__r_00);
        std::shared_ptr<mocker::ir::IRInst>::~shared_ptr((shared_ptr<mocker::ir::IRInst> *)__r_00);
        ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>&>((ir *)local_3d8,v_00);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_3d8);
        if (bVar2) {
          peVar15 = std::
                    __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_3d8);
          psVar19 = ir::Branch::getCondition(peVar15);
          peVar15 = std::
                    __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_3d8);
          p_Var16 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)ir::Branch::getThen(peVar15);
          peVar17 = std::
                    __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var16);
          local_400 = ir::Label::getID(peVar17);
          std::
          unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::at((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                *)&riter,&local_400);
          std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_3f8);
          peVar15 = std::
                    __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_3d8);
          p_Var16 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)ir::Branch::getElse(peVar15);
          peVar17 = std::
                    __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var16);
          jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ir::Label::getID(peVar17);
          std::
          unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::at((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                *)&riter,
               (key_type *)
               &jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_410);
          std::
          make_shared<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>>
                    (&local_3e8,(shared_ptr<mocker::ir::Label> *)psVar19,&local_3f8);
          std::shared_ptr<mocker::ir::IRInst>::operator=
                    (v_00,(shared_ptr<mocker::ir::Branch> *)&local_3e8);
          std::shared_ptr<mocker::ir::Branch>::~shared_ptr
                    ((shared_ptr<mocker::ir::Branch> *)&local_3e8);
          std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_410);
          std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_3f8);
        }
        else {
          ir::dyc<mocker::ir::Jump,std::shared_ptr<mocker::ir::IRInst>&>((ir *)local_428,v_00);
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_428);
          if (bVar2) {
            this_07 = std::
                      __shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_428);
            p_Var16 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ir::Jump::getLabel(this_07);
            peVar17 = std::
                      __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var16);
            alloca.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ir::Label::getID(peVar17);
            std::
            unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::at((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  *)&riter,
                 (key_type *)
                 &alloca.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
            std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_448);
            std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>>
                      ((shared_ptr<mocker::ir::Label> *)&local_438);
            std::shared_ptr<mocker::ir::IRInst>::operator=(v_00,&local_438);
            std::shared_ptr<mocker::ir::Jump>::~shared_ptr(&local_438);
            std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_448);
          }
          std::shared_ptr<mocker::ir::Jump>::~shared_ptr((shared_ptr<mocker::ir::Jump> *)local_428);
        }
        std::shared_ptr<mocker::ir::Branch>::~shared_ptr
                  ((shared_ptr<mocker::ir::Branch> *)local_3d8);
        ir::dyc<mocker::ir::Alloca,std::shared_ptr<mocker::ir::IRInst>&>((ir *)local_460,v_00);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_460);
        if (bVar2) {
          local_468._M_node = (_List_node_base *)ir::FunctionModule::getFirstBB(caller);
          pBVar8 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&local_468);
          pIVar9 = ir::BasicBlock::getMutableInsts_abi_cxx11_(pBVar8);
          std::__cxx11::
          list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
          ::push_front(pIVar9,v_00);
          std::make_shared<mocker::ir::Deleted>();
          std::shared_ptr<mocker::ir::IRInst>::operator=
                    (v_00,(shared_ptr<mocker::ir::Deleted> *)&iter_1);
          std::shared_ptr<mocker::ir::Deleted>::~shared_ptr
                    ((shared_ptr<mocker::ir::Deleted> *)&iter_1);
        }
        std::shared_ptr<mocker::ir::Alloca>::~shared_ptr
                  ((shared_ptr<mocker::ir::Alloca> *)local_460);
        std::
        vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ::~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                   *)&__range3);
        std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
      }
      std::_List_iterator<mocker::ir::BasicBlock>::operator++
                ((_List_iterator<mocker::ir::BasicBlock> *)&bb_1);
    }
    bb_2 = (BasicBlock *)iter._M_node;
    while (bVar2 = std::operator!=((_Self *)&bb_2,&bbIter_local), bVar2) {
      ret.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_List_iterator<mocker::ir::BasicBlock>::operator*
                     ((_List_iterator<mocker::ir::BasicBlock> *)&bb_2);
      pIVar9 = ir::BasicBlock::getMutableInsts_abi_cxx11_
                         ((BasicBlock *)
                          ret.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
      v_01 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::back(pIVar9);
      ir::dyc<mocker::ir::Ret,std::shared_ptr<mocker::ir::IRInst>&>((ir *)local_498,v_01);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_498);
      if (bVar2) {
        pIVar9 = ir::BasicBlock::getMutableInsts_abi_cxx11_
                           ((BasicBlock *)
                            ret.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
        std::__cxx11::
        list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
        ::pop_back(pIVar9);
        peVar3 = std::
                 __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&callee.predecessors._M_h._M_single_bucket);
        p_Var7 = (__shared_ptr *)ir::Definition::getDest(&peVar3->super_Definition);
        bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var7);
        _Var1 = ret.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        if (bVar2) {
          peVar18 = std::
                    __shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_498);
          local_4dd = 0;
          p_Var7 = (__shared_ptr *)ir::Ret::getVal(peVar18);
          bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var7);
          if (bVar2) {
            peVar18 = std::
                      __shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_498);
            psVar19 = ir::Ret::getVal(peVar18);
            std::shared_ptr<mocker::ir::Addr>::shared_ptr(&local_4c8,psVar19);
          }
          else {
            local_4dc = 0;
            std::make_shared<mocker::ir::IntLiteral,int>((int *)&local_4d8);
            local_4dd = 1;
            std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::IntLiteral,void>
                      (&local_4c8,&local_4d8);
          }
          std::
          make_shared<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>const>
                    (&local_4b8,(shared_ptr<mocker::ir::Addr> *)(local_148 + 0x10));
          std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Store,void>
                    (&local_4a8,(shared_ptr<mocker::ir::Store> *)&local_4b8);
          ir::BasicBlock::appendInst((BasicBlock *)_Var1._M_pi,&local_4a8);
          std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_4a8);
          std::shared_ptr<mocker::ir::Store>::~shared_ptr
                    ((shared_ptr<mocker::ir::Store> *)&local_4b8);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_4c8);
          if ((local_4dd & 1) != 0) {
            std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr(&local_4d8);
          }
        }
        _Var1._M_pi = ret.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        pBVar8 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&bbIter_local);
        ir::BasicBlock::getLabelID(pBVar8);
        std::make_shared<mocker::ir::Label,unsigned_long>((unsigned_long *)&local_510);
        std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>>
                  ((shared_ptr<mocker::ir::Label> *)&local_500);
        this_08 = &local_4f0;
        std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Jump,void>(this_08,&local_500);
        ir::BasicBlock::appendInst((BasicBlock *)_Var1._M_pi,this_08);
        std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_4f0);
        std::shared_ptr<mocker::ir::Jump>::~shared_ptr(&local_500);
        std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_510);
        retVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
      }
      else {
        retVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0xe;
      }
      std::shared_ptr<mocker::ir::Ret>::~shared_ptr((shared_ptr<mocker::ir::Ret> *)local_498);
      std::_List_iterator<mocker::ir::BasicBlock>::operator++
                ((_List_iterator<mocker::ir::BasicBlock> *)&bb_2);
    }
    retVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&insertedBeg);
    std::
    unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~unordered_map((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      *)&riter);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)(local_148 + 0x10))
    ;
  }
  ir::FunctionModule::~FunctionModule((FunctionModule *)&stack0xfffffffffffffee8);
  std::shared_ptr<mocker::ir::Call>::~shared_ptr
            ((shared_ptr<mocker::ir::Call> *)&callee.predecessors._M_h._M_single_bucket);
  return (BBLIter)bbIter_local._M_node;
}

Assistant:

ir::BBLIter FunctionInline::inlineFunction(ir::FunctionModule &caller,
                                           ir::BBLIter bbIter,
                                           ir::InstListIter callInstIter) {
  auto call = ir::dyc<ir::Call>(*callInstIter);
  // do not use a reference here
  auto callee = module.getFuncs().at(call->getFuncName());
  if (callee.isExternalFunc())
    return ++bbIter;

  // create a temporary variable to hold the return value
  std::shared_ptr<ir::Reg> retVal = nullptr;
  if (call->getDest()) {
    retVal = caller.makeTempLocalReg("retVal");
    caller.getFirstBB()->appendInstFront(std::make_shared<ir::Alloca>(retVal));
  }

  // move the subsequent instructions to a new BB
  auto succBBIter = caller.insertBBAfter(bbIter);
  succBBIter->getMutableInsts().splice(succBBIter->getMutableInsts().end(),
                                       bbIter->getMutableInsts(), callInstIter,
                                       bbIter->getMutableInsts().end());
  succBBIter->getMutableInsts().pop_front();
  if (call->getDest())
    succBBIter->getMutableInsts().emplace_front(
        std::make_shared<ir::Load>(call->getDest(), retVal));

  // insert new BBs
  std::unordered_map<std::size_t, std::size_t> newLabelID;
  for (auto riter = callee.getBBs().rbegin(); riter != callee.getBBs().rend();
       ++riter) {
    const auto &bb = *riter;
    auto &curBB = *caller.insertBBAfter(bbIter);
    curBB.getMutableInsts() = bb.getInsts();
    newLabelID[bb.getLabelID()] = curBB.getLabelID();
  }
  bbIter->appendInst(std::make_shared<ir::Jump>(std::make_shared<ir::Label>(
      newLabelID.at(callee.getFirstBB()->getLabelID()))));

  // rename identifiers & LabelID; move alloca's to the first block
  std::unordered_map<std::string, std::string> newIdent;
  auto insertedBeg = bbIter;
  ++insertedBeg;
  for (auto iter = insertedBeg; iter != succBBIter; ++iter) {
    auto &bb = *iter;
    for (auto &inst : bb.getMutableInsts()) {
      assert(!ir::dyc<ir::Phi>(inst));
      if (auto dest = ir::dycLocalReg(ir::getDest(inst))) {
        auto newDest = caller.makeTempLocalReg(dest->getIdentifier());
        inst = ir::copyWithReplacedDest(inst, newDest);
        newIdent[dest->getIdentifier()] = newDest->getIdentifier();
      }

      auto operands = ir::getOperandsUsed(inst);
      for (auto &operand : operands) {
        auto reg = ir::dycLocalReg(operand);
        if (!reg)
          continue;
        if (isParameter(callee, reg->getIdentifier())) {
          auto n = std::stol(reg->getIdentifier(), nullptr);
          operand = call->getArgs().at((std::size_t)n);
          continue;
        }
        operand = std::make_shared<ir::Reg>(newIdent.at(reg->getIdentifier()));
      }
      inst = ir::copyWithReplacedOperands(inst, operands);

      if (auto br = ir::dyc<ir::Branch>(inst)) {
        inst = std::make_shared<ir::Branch>(
            br->getCondition(),
            std::make_shared<ir::Label>(newLabelID.at(br->getThen()->getID())),
            std::make_shared<ir::Label>(newLabelID.at(br->getElse()->getID())));
      } else if (auto jump = ir::dyc<ir::Jump>(inst)) {
        inst = std::make_shared<ir::Jump>(std::make_shared<ir::Label>(
            newLabelID.at(jump->getLabel()->getID())));
      }

      if (auto alloca = ir::dyc<ir::Alloca>(inst)) {
        caller.getFirstBB()->getMutableInsts().push_front(std::move(inst));
        inst = std::make_shared<ir::Deleted>();
      }
    }
  }

  // rewrite Ret's
  for (auto iter = insertedBeg; iter != succBBIter; ++iter) {
    auto &bb = *iter;
    auto ret = ir::dyc<ir::Ret>(bb.getMutableInsts().back());
    if (!ret)
      continue;
    bb.getMutableInsts().pop_back();
    if (call->getDest()) {
      bb.appendInst(std::make_shared<ir::Store>(
          retVal,
          ret->getVal() ? ret->getVal() : std::make_shared<ir::IntLiteral>(0)));
    }
    bb.appendInst(std::make_shared<ir::Jump>(
        std::make_shared<ir::Label>(succBBIter->getLabelID())));
  }

  return succBBIter;
}